

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O0

void __thiscall
MC::MC_Driver::addIndexParam(MC_Driver *this,string *indexName,string *tableName,string *colunmName)

{
  string *colunmName_local;
  string *tableName_local;
  string *indexName_local;
  MC_Driver *this_local;
  
  std::__cxx11::string::operator=((string *)&this->indexInfo->indexName,(string *)indexName);
  std::__cxx11::string::operator=((string *)&this->indexInfo->tableName,(string *)tableName);
  std::__cxx11::string::operator=((string *)&this->indexInfo->colunmName,(string *)colunmName);
  return;
}

Assistant:

void MC::MC_Driver::addIndexParam(std::string indexName, std::string tableName, std::string colunmName){
    indexInfo->indexName = indexName;
    indexInfo->tableName = tableName;
    indexInfo->colunmName = colunmName;
}